

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cc
# Opt level: O0

btree_result
btree_init(btree *btree,void *blk_handle,btree_blk_ops *blk_ops,btree_kv_ops *kv_ops,
          uint32_t nodesize,uint8_t ksize,uint8_t vsize,bnode_flag_t flag,btree_meta *meta)

{
  size_t sVar1;
  btree_kv_ops *in_RCX;
  btree_blk_ops *in_RDX;
  void *in_RSI;
  btree *in_RDI;
  uint32_t in_R8D;
  uint8_t in_R9B;
  size_t subblock_size;
  size_t min_nodesize;
  void *addr;
  undefined3 in_stack_00000018;
  ulong local_40;
  undefined3 in_stack_ffffffffffffffd0;
  undefined4 uVar2;
  undefined4 uVar3;
  btree_result local_4;
  
  uVar2 = CONCAT13(in_R9B,in_stack_ffffffffffffffd0);
  in_RDI->root_flag = (ushort)addr | 1;
  in_RDI->blk_ops = in_RDX;
  in_RDI->blk_handle = in_RSI;
  in_RDI->kv_ops = in_RCX;
  in_RDI->height = 1;
  in_RDI->blksize = in_R8D;
  in_RDI->ksize = in_R9B;
  in_RDI->vsize = (uint8_t)min_nodesize;
  if (CONCAT44(nodesize,_in_stack_00000018) == 0) {
    local_40 = 0x11;
  }
  else {
    in_RDI->root_flag = in_RDI->root_flag | 2;
    local_40 = ((ulong)*(ushort *)CONCAT44(nodesize,_in_stack_00000018) + 0x11 & 0xfffffffffffffff0)
               + 0x11;
  }
  if (in_RDI->blksize < local_40) {
    local_4 = BTREE_RESULT_FAIL;
  }
  else {
    if ((in_RDI->blk_ops->blk_alloc_sub == (_func_voidref_void_ptr_bid_t_ptr *)0x0) ||
       (in_RDI->blk_ops->blk_enlarge_node == (_func_voidref_void_ptr_bid_t_size_t_bid_t_ptr *)0x0))
    {
      (*in_RDI->blk_ops->blk_alloc)(in_RDI->blk_handle,&in_RDI->root_bid);
      uVar3 = (undefined4)((ulong)in_RCX >> 0x20);
    }
    else {
      (*in_RDI->blk_ops->blk_alloc_sub)(in_RDI->blk_handle,&in_RDI->root_bid);
      uVar3 = (undefined4)((ulong)in_RCX >> 0x20);
      if ((CONCAT44(nodesize,_in_stack_00000018) != 0) &&
         (sVar1 = (*in_RDI->blk_ops->blk_get_size)(in_RDI->blk_handle,in_RDI->root_bid),
         sVar1 < local_40)) {
        (*in_RDI->blk_ops->blk_enlarge_node)
                  (in_RDI->blk_handle,in_RDI->root_bid,local_40,&in_RDI->root_bid);
      }
    }
    _btree_init_node(in_RDI,(bid_t)in_RSI,in_RDX,(bnode_flag_t)((uint)uVar3 >> 0x10),(uint16_t)uVar3
                     ,(btree_meta *)CONCAT44(in_R8D,uVar2));
    local_4 = BTREE_RESULT_SUCCESS;
  }
  return local_4;
}

Assistant:

btree_result btree_init(
        struct btree *btree, void *blk_handle,
        struct btree_blk_ops *blk_ops,     struct btree_kv_ops *kv_ops,
        uint32_t nodesize, uint8_t ksize, uint8_t vsize,
        bnode_flag_t flag, struct btree_meta *meta)
{
    void *addr;
    size_t min_nodesize = 0;

    btree->root_flag = BNODE_MASK_ROOT | flag;
    btree->blk_ops = blk_ops;
    btree->blk_handle = blk_handle;
    btree->kv_ops = kv_ops;
    btree->height = 1;
    btree->blksize = nodesize;
    btree->ksize = ksize;
    btree->vsize = vsize;
    if (meta) {
        btree->root_flag |= BNODE_MASK_METADATA;
        min_nodesize = sizeof(struct bnode) + _metasize_align(meta->size) +
                       sizeof(metasize_t) + BLK_MARKER_SIZE;
    } else {
        min_nodesize = sizeof(struct bnode) + BLK_MARKER_SIZE;
    }

    if (min_nodesize > btree->blksize) {
        // too large metadata .. init fail
        return BTREE_RESULT_FAIL;
    }

    // create the first root node
    if (btree->blk_ops->blk_alloc_sub && btree->blk_ops->blk_enlarge_node) {
        addr = btree->blk_ops->blk_alloc_sub(btree->blk_handle, &btree->root_bid);
        if (meta) {
            // check if the initial node size including metadata is
            // larger than the subblock size
            size_t subblock_size;
            subblock_size = btree->blk_ops->blk_get_size(btree->blk_handle,
                                                         btree->root_bid);
            if (subblock_size < min_nodesize) {
                addr = btree->blk_ops->blk_enlarge_node(btree->blk_handle,
                                                        btree->root_bid,
                                                        min_nodesize,
                                                        &btree->root_bid);
            }
        }
    } else {
        addr = btree->blk_ops->blk_alloc (btree->blk_handle, &btree->root_bid);
    }
    _btree_init_node(btree, btree->root_bid, addr,
                     btree->root_flag, BNODE_MASK_ROOT, meta);

    return BTREE_RESULT_SUCCESS;
}